

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::BuildSystemRule::BuildSystemRule
          (BuildSystemRule *this,KeyType *key,CommandSignature *signature,
          function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *action,
          function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
          *valid,function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>
                 *update)

{
  llbuild::core::Rule::Rule(&this->super_Rule,key,signature);
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__BuildSystemRule_001dac40;
  std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::function(&this->action,action)
  ;
  std::
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::function(&this->resultValid,valid);
  std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::function
            (&this->update,update);
  return;
}

Assistant:

BuildSystemRule(
    const KeyType& key,
    const basic::CommandSignature& signature,
    std::function<Task*(BuildEngine&)> action,
    std::function<bool(BuildEngine&, const Rule&, const ValueType&)> valid = nullptr,
    std::function<void(BuildEngine&, StatusKind)> update = nullptr)
  : Rule(key, signature), action(action), resultValid(valid), update(update)
  { }